

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O2

void __thiscall indk::Neuron::doFinalize(Neuron *this)

{
  pointer ppVar1;
  pointer ppRVar2;
  pointer ppVar3;
  pointer ppRVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  E;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  pStack_48;
  
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (this->Entries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
    ::pair(&pStack_48,ppVar3);
    Entry::doFinalize(pStack_48.second);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  ppRVar2 = (this->Receptors).
            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar4 = (this->Receptors).
                 super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar4 != ppRVar2;
      ppRVar4 = ppRVar4 + 1) {
    Receptor::doLock(*ppRVar4);
  }
  this->Learned = true;
  return;
}

Assistant:

void indk::Neuron::doFinalize() {
    for (auto E: Entries) E.second -> doFinalize();
    for (auto R: Receptors) R -> doLock();
    Learned = true;
}